

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Addr deref(Machine *m,Addr a)

{
  Addr AVar1;
  Addr a_00;
  Addr a_01;
  AddrTag AVar2;
  Hix hix;
  bool local_1f1;
  Addr local_19c;
  Machine local_190;
  int local_11c;
  Addr local_118 [2];
  Addr local_100;
  Addr local_f0;
  Machine local_e0;
  undefined1 local_70 [8];
  Hcell hc;
  Machine *m_local;
  undefined1 local_28 [8];
  Addr a_local;
  Register RStack_14;
  
  a_local.tag_ = (AddrTag)a.hix_.hix;
  local_28 = a._0_8_;
  hc.f_._32_8_ = m;
  Machine::Machine(&local_e0,m);
  local_f0.hix_.hix = a_local.tag_;
  local_f0.tag_ = local_28._0_4_;
  local_f0.r_.r = local_28._4_4_;
  local_100.hix_.hix = a_local.tag_;
  local_100.tag_ = local_28._0_4_;
  local_100.r_.r = local_28._4_4_;
  a_01.hix_.hix = a_local.tag_;
  a_01.tag_ = local_28._0_4_;
  a_01.r_.r = local_28._4_4_;
  machineAtAddr((Hcell *)local_70,&local_e0,a_01);
  Machine::~Machine(&local_e0);
  local_1f1 = false;
  if (local_70._0_4_ == Ref) {
    local_11c = (int)Hcell::hix((Hcell *)local_70);
    Addr::Addr(local_118,(Hix)local_11c);
    local_1f1 = Addr::operator!=(local_118,(Addr *)local_28);
  }
  if (local_1f1 != false) {
    Machine::Machine(&local_190,m);
    hix = Hcell::hix((Hcell *)local_70);
    Addr::Addr(&local_19c,hix);
    a_00.hix_.hix = local_19c.hix_.hix;
    a_00.tag_ = local_19c.tag_;
    a_00.r_.r = local_19c.r_.r;
    deref(&local_190,a_00);
    Machine::~Machine(&local_190);
  }
  AVar2 = a_local.tag_;
  a_local.hix_.hix = local_28._0_4_;
  RStack_14.r = local_28._4_4_;
  Hcell::~Hcell((Hcell *)local_70);
  AVar1.hix_.hix = AVar2;
  AVar1.tag_ = a_local.hix_.hix;
  AVar1.r_.r = RStack_14.r;
  return AVar1;
}

Assistant:

Addr deref(Machine m, Addr a) {
    const Hcell hc = machineAtAddr(m, a);
    // if we have a reference to chase which is not pointing to itself, then
    // chase it
    if (hc.tag == Htag::Ref && Addr(hc.hix()) != a) {
        deref(m, hc.hix());
    }
    return a;
}